

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalhash.h
# Opt level: O3

void __thiscall
GeneralHash<0,_unsigned_int,_unsigned_char>::update
          (GeneralHash<0,_unsigned_int,_unsigned_char> *this,uchar outchar,uchar inchar)

{
  uint uVar1;
  undefined7 in_register_00000031;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = this->n;
  uVar1 = (this->hasher).hashvalues[CONCAT71(in_register_00000031,outchar) & 0xffffffff];
  if (0 < iVar2) {
    do {
      uVar4 = this->irreduciblepoly;
      if ((this->lastbit & ~(uVar1 * 2)) != 0) {
        uVar4 = 0;
      }
      uVar1 = uVar1 * 2 ^ uVar4;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  uVar4 = this->hashvalue * 2;
  uVar3 = 0;
  if ((this->lastbit & ~uVar4) == 0) {
    uVar3 = this->irreduciblepoly;
  }
  this->hashvalue = uVar1 ^ (this->hasher).hashvalues[inchar] ^ uVar3 ^ uVar4;
  return;
}

Assistant:

void update(chartype outchar, chartype inchar) {
    hashvalue <<= 1;
    if ((hashvalue & lastbit) == lastbit)
      hashvalue ^= irreduciblepoly;
    //
    hashvaluetype z(hasher.hashvalues[outchar]);
    // the compiler should optimize away the next if/else
    if (precomputationtype == FULLPRECOMP) {
      fastleftshiftn(z);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    } else {
      fastleftshift(z, n);
      hashvalue ^= z ^ hasher.hashvalues[inchar];
    }
  }